

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

void uv__write_int(int fd,int val)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  ssize_t n;
  int val_local;
  int fd_local;
  
  n._0_4_ = val;
  n._4_4_ = fd;
  do {
    sVar1 = write(n._4_4_,&n,4);
    bVar3 = false;
    if (sVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (((sVar1 != -1) || (piVar2 = __errno_location(), *piVar2 != 0x20)) && (sVar1 != 4)) {
    __assert_fail("n == sizeof(val)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/process.c"
                  ,0x102,"void uv__write_int(int, int)");
  }
  return;
}

Assistant:

static void uv__write_int(int fd, int val) {
  ssize_t n;

  do
    n = write(fd, &val, sizeof(val));
  while (n == -1 && errno == EINTR);

  if (n == -1 && errno == EPIPE)
    return; /* parent process has quit */

  assert(n == sizeof(val));
}